

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O0

MPP_RET vp9d_paser_reset(Vp9CodecContext *ctx)

{
  VP9Context *s_00;
  void *pvVar1;
  void *__s;
  VP9ParseContext *pc;
  SplitContext_t_conflict *ps;
  VP9Context *s;
  RK_S32 i;
  Vp9CodecContext *ctx_local;
  
  s_00 = (VP9Context *)ctx->priv_data;
  pvVar1 = ctx->priv_data2;
  __s = *(void **)((long)pvVar1 + 0x58);
  s_00->got_keyframes = 0;
  s_00->cur_poc = 0;
  for (s._4_4_ = 0; s._4_4_ < 3; s._4_4_ = s._4_4_ + 1) {
    if (s_00->frames[s._4_4_].ref != (RefInfo *)0x0) {
      vp9_unref_frame(s_00,s_00->frames + s._4_4_);
    }
  }
  for (s._4_4_ = 0; s._4_4_ < 8; s._4_4_ = s._4_4_ + 1) {
    if (s_00->refs[s._4_4_].ref != (RefInfo *)0x0) {
      vp9_unref_frame(s_00,s_00->refs + s._4_4_);
    }
  }
  memset(__s,0,0x30);
  s_00->eos = 0;
  if (pvVar1 != (void *)0x0) {
    *(undefined4 *)((long)pvVar1 + 0x104) = 0;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp9d_paser_reset(Vp9CodecContext *ctx)
{
    RK_S32 i;
    VP9Context *s = ctx->priv_data;
    SplitContext_t *ps = (SplitContext_t *)ctx->priv_data2;
    VP9ParseContext *pc = (VP9ParseContext *)ps->priv_data;

    s->got_keyframes = 0;
    s->cur_poc = 0;
    for (i = 0; i < 3; i++) {
        if (s->frames[i].ref) {
            vp9_unref_frame(s, &s->frames[i]);
        }
    }
    for (i = 0; i < 8; i++) {
        if (s->refs[i].ref) {
            vp9_unref_frame(s, &s->refs[i]);
        }
    }
    memset(pc, 0, sizeof(VP9ParseContext));

    s->eos = 0;
    if (ps) {
        ps->eos = 0;
    }
    return MPP_OK;
}